

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O2

from_chars_result_t<char>
fast_float::from_chars_advanced<float,char>
          (char *first,char *last,float *value,parse_options_t<char> options)

{
  char cVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  from_chars_result_t<char> fVar15;
  from_chars_result_t<char> fVar16;
  from_chars_result_t<char> fVar17;
  from_chars_result_t<char> fVar18;
  from_chars_result_t<char> fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  bool bVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  byte *pbVar28;
  ulong uVar29;
  byte *pbVar30;
  byte *pbVar31;
  size_t sVar32;
  ulong uVar33;
  uint uVar34;
  long lVar35;
  byte *pbVar36;
  long lVar37;
  byte *pbVar38;
  ulong uVar39;
  float fVar40;
  from_chars_result_t<char> fVar41;
  adjusted_mantissa aVar42;
  byte local_88;
  parsed_number_string_t<char> answer;
  
  if (first == last) {
    fVar41._8_8_ = 0x16;
    fVar41.ptr = first;
    return fVar41;
  }
  answer.fraction.ptr = (char *)0x0;
  answer.fraction.length = 0;
  answer.integer.ptr = (char *)0x0;
  answer.integer.length = 0;
  answer.exponent = 0;
  answer.mantissa._0_3_ = 0;
  answer.mantissa._3_5_ = 0;
  answer.lastmatch._0_3_ = 0;
  answer.lastmatch._3_5_ = 0;
  answer.valid = false;
  answer.too_many_digits = false;
  cVar1 = *first;
  answer.negative = cVar1 == '-';
  local_88 = options.decimal_point;
  pbVar28 = (byte *)first;
  if ((answer.negative) &&
     ((pbVar28 = (byte *)(first + 1), pbVar28 == (byte *)last ||
      (*pbVar28 != local_88 && 9 < (byte)(*pbVar28 - 0x30))))) goto LAB_00312dd0;
  sVar32 = (long)last - (long)pbVar28;
  uVar39 = 0;
  for (answer.integer.length = 0; pbVar36 = pbVar28 + answer.integer.length, pbVar36 != (byte *)last
      ; answer.integer.length = answer.integer.length + 1) {
    bVar2 = *pbVar36;
    if (9 < (byte)(bVar2 - 0x30)) {
      if (bVar2 == local_88) {
        lVar37 = (sVar32 - 1) - answer.integer.length;
        answer.fraction.ptr = (char *)(pbVar28 + answer.integer.length + 1);
        pbVar38 = (byte *)answer.fraction.ptr;
        while ((7 < lVar37 &&
               (aVar42.mantissa = *(long *)pbVar38 + 0xcfcfcfcfcfcfcfd0,
               ((*(long *)pbVar38 + 0x4646464646464646U | aVar42.mantissa) & 0x8080808080808080) ==
               0))) {
          aVar42.mantissa = (aVar42.mantissa >> 8) + aVar42.mantissa * 10;
          uVar39 = ((aVar42.mantissa >> 0x10 & 0xff000000ff) * 0x271000000001 +
                    (aVar42.mantissa & 0xff000000ff) * 0xf424000000064 >> 0x20) + uVar39 * 100000000
          ;
          pbVar38 = pbVar38 + 8;
          lVar37 = lVar37 + -8;
        }
        for (; (pbVar31 = (byte *)last, pbVar38 != (byte *)last &&
               (pbVar31 = pbVar38, (byte)(*pbVar38 - 0x30) < 10)); pbVar38 = pbVar38 + 1) {
          uVar39 = (ulong)(byte)(*pbVar38 - 0x30) + uVar39 * 10;
        }
        pbVar38 = pbVar28 + (answer.integer.length - (long)pbVar31) + 1;
        answer.fraction.length = (size_t)(pbVar31 + (~(ulong)pbVar28 - answer.integer.length));
        sVar32 = answer.integer.length - (long)pbVar38;
      }
      else {
        pbVar38 = (byte *)0x0;
        sVar32 = answer.integer.length;
        pbVar31 = pbVar36;
      }
      goto LAB_00312d8c;
    }
    uVar39 = (uVar39 * 10 + (ulong)bVar2) - 0x30;
  }
  pbVar38 = (byte *)0x0;
  pbVar36 = (byte *)last;
  pbVar31 = (byte *)last;
  answer.integer.length = sVar32;
LAB_00312d8c:
  answer.integer.ptr = (char *)pbVar28;
  if (sVar32 == 0) goto LAB_00312dd0;
  if (((ulong)options & 1) == 0) {
LAB_00312e42:
    lVar37 = 0;
  }
  else {
    if ((pbVar31 == (byte *)last) || ((*pbVar31 | 0x20) != 0x65)) {
joined_r0x00312dce:
      if (((ulong)options & 4) == 0) {
LAB_00312dd0:
        fVar41 = detail::parse_infnan<float,char>(first,last,value);
        return fVar41;
      }
      goto LAB_00312e42;
    }
    pbVar30 = pbVar31 + 1;
    if (pbVar30 == (byte *)last) {
LAB_00312dee:
      bVar22 = false;
    }
    else {
      if (*pbVar30 != 0x2d) {
        if (*pbVar30 == 0x2b) {
          pbVar30 = pbVar31 + 2;
        }
        goto LAB_00312dee;
      }
      pbVar30 = pbVar31 + 2;
      bVar22 = true;
    }
    if ((pbVar30 == (byte *)last) || (9 < (byte)(*pbVar30 - 0x30))) goto joined_r0x00312dce;
    lVar35 = 0;
    for (; (pbVar31 = (byte *)last, pbVar30 != (byte *)last &&
           (pbVar31 = pbVar30, (byte)(*pbVar30 - 0x30) < 10)); pbVar30 = pbVar30 + 1) {
      if (lVar35 < 0x10000000) {
        lVar35 = (ulong)(byte)(*pbVar30 - 0x30) + lVar35 * 10;
      }
    }
    lVar37 = -lVar35;
    if (!bVar22) {
      lVar37 = lVar35;
    }
    pbVar38 = pbVar38 + lVar37;
  }
  answer.lastmatch._0_3_ = SUB83(pbVar31,0);
  answer.lastmatch._3_5_ = (undefined5)((ulong)pbVar31 >> 0x18);
  answer.valid = true;
  pbVar30 = pbVar28;
  if ((long)sVar32 < 0x14) {
    bVar22 = false;
  }
  else {
    for (; (pbVar30 != (byte *)last && (bVar2 = *pbVar30, bVar2 == local_88 || bVar2 == 0x30));
        pbVar30 = pbVar30 + 1) {
      sVar32 = sVar32 - (bVar2 == 0x30);
    }
    if ((long)sVar32 < 0x14) {
      bVar22 = false;
    }
    else {
      answer.too_many_digits = true;
      uVar39 = 0;
      for (sVar32 = answer.integer.length; (uVar39 < 1000000000000000000 && (sVar32 != 0));
          sVar32 = sVar32 - 1) {
        uVar39 = (uVar39 * 10 + (long)(char)*pbVar28) - 0x30;
        pbVar28 = pbVar28 + 1;
      }
      pbVar38 = (byte *)answer.fraction.ptr;
      sVar32 = answer.fraction.length;
      if (uVar39 < 1000000000000000000) {
        for (; (pbVar28 = pbVar38, pbVar36 = (byte *)answer.fraction.ptr,
               uVar39 < 1000000000000000000 && (sVar32 != 0)); sVar32 = sVar32 - 1) {
          uVar39 = (uVar39 * 10 + (long)(char)*pbVar38) - 0x30;
          pbVar38 = pbVar38 + 1;
        }
      }
      pbVar38 = pbVar36 + (lVar37 - (long)pbVar28);
      bVar22 = true;
    }
  }
  answer.mantissa._0_3_ = (undefined3)uVar39;
  answer.mantissa._3_5_ = (undefined5)(uVar39 >> 0x18);
  if ((byte *)0xffffffffffffffea < pbVar38 + -0xb && !bVar22) {
    if ((detail::rounds_to_nearest()::fmin + 1.0 != 1.0 - detail::rounds_to_nearest()::fmin) ||
       (NAN(detail::rounds_to_nearest()::fmin + 1.0) || NAN(1.0 - detail::rounds_to_nearest()::fmin)
       )) {
      if ((-1 < (long)pbVar38) &&
         (uVar39 <= *(ulong *)(binary_format_lookup_tables<float,void>::max_mantissa +
                              (long)pbVar38 * 8))) {
        if (uVar39 == 0) {
          if (cVar1 == '-') {
            fVar40 = -0.0;
          }
          else {
            fVar40 = 0.0;
          }
          *value = fVar40;
          fVar19._8_8_ = 0;
          fVar19.ptr = (char *)pbVar31;
          return fVar19;
        }
        fVar40 = (float)uVar39 *
                 *(float *)(binary_format_lookup_tables<float,void>::powers_of_ten +
                           (long)pbVar38 * 4);
        goto LAB_00313104;
      }
    }
    else if (uVar39 < 0x1000001) {
      fVar40 = (float)(long)uVar39;
      *value = fVar40;
      if ((long)pbVar38 < 0) {
        fVar40 = fVar40 / *(float *)(binary_format_lookup_tables<float,void>::powers_of_ten +
                                    (long)pbVar38 * -4);
      }
      else {
        fVar40 = fVar40 * *(float *)(binary_format_lookup_tables<float,void>::powers_of_ten +
                                    (long)pbVar38 * 4);
      }
LAB_00313104:
      fVar16._8_8_ = 0;
      fVar16.ptr = (char *)pbVar31;
      fVar15._8_8_ = 0;
      fVar15.ptr = (char *)pbVar31;
      *value = fVar40;
      if (cVar1 != '-') {
        return fVar15;
      }
      *value = -fVar40;
      return fVar16;
    }
  }
  uVar34 = 0;
  iVar24 = (int)pbVar38;
  if ((long)pbVar38 < -0x41) {
LAB_00312fe0:
    aVar42.mantissa = 0;
  }
  else {
    aVar42.mantissa = 0;
    uVar34 = 0;
    if (uVar39 != 0) {
      if (0x26 < (long)pbVar38) {
        uVar34 = 0xff;
        goto LAB_00312fe0;
      }
      aVar42.mantissa = 0x3f;
      if (uVar39 != 0) {
        for (; uVar39 >> aVar42.mantissa == 0; aVar42.mantissa = aVar42.mantissa - 1) {
        }
      }
      uVar33 = uVar39 << ((byte)(aVar42.mantissa ^ 0x3f) & 0x3f);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar33;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(powers_template<void>::power_of_five_128 +
                               (long)(iVar24 * 2 + 0x2ac) * 8);
      auVar3 = auVar3 * auVar9;
      if ((~auVar3._8_8_ & 0x3fffffffff) == 0) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar33;
        auVar10._8_8_ = 0;
        auVar10._0_8_ =
             *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar24 * 2 + 0x2ad) * 8);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = SUB168(auVar4 * auVar10,8);
        auVar3 = auVar3 + auVar20;
      }
      iVar26 = ((iVar24 * 0x3526a >> 0x10) - (int)(aVar42.mantissa ^ 0x3f)) -
               (auVar3._12_4_ >> 0x1f);
      iVar23 = iVar26 + 0xbe;
      bVar2 = auVar3[0xf] >> 7;
      aVar42.mantissa = auVar3._8_8_ >> (bVar2 | 0x26);
      if (iVar23 < 1) {
        uVar34 = 1 - iVar23;
        if (0x3f < uVar34) {
          uVar34 = 0;
          goto LAB_00312fe0;
        }
        uVar33 = (aVar42.mantissa >> ((byte)uVar34 & 0x3f)) +
                 (ulong)((aVar42.mantissa >> ((ulong)uVar34 & 0x3f) & 1) != 0);
        aVar42.mantissa = uVar33 >> 1 & 0x7fffffff;
        uVar34 = (uint)(0xffffff < uVar33);
      }
      else {
        uVar33 = (ulong)((uint)aVar42.mantissa & 0x3fffffe);
        if (aVar42.mantissa << (bVar2 | 0x26) != auVar3._8_8_ || ((uint)aVar42.mantissa & 3) != 1) {
          uVar33 = aVar42.mantissa;
        }
        if (1 < auVar3._0_8_) {
          uVar33 = aVar42.mantissa;
        }
        if ((byte *)0x1b < pbVar38 + 0x11) {
          uVar33 = aVar42.mantissa;
        }
        uVar33 = ((uint)uVar33 & 1) + uVar33;
        uVar34 = (iVar26 + 0xbf) - (uint)(uVar33 < 0x2000000);
        aVar42.mantissa = (ulong)((uint)(uVar33 >> 1) & 0x37fffff);
        if (0x1ffffff < uVar33) {
          aVar42.mantissa = 0;
        }
        if (0xfe < uVar34) {
          aVar42.mantissa = 0;
          uVar34 = 0xff;
        }
      }
    }
  }
  if (!bVar22) goto LAB_003133ad;
  uVar33 = uVar39 + 1;
  uVar27 = 0;
  if ((long)pbVar38 < -0x41) {
LAB_003131b0:
    uVar25 = 0;
  }
  else {
    uVar25 = 0;
    uVar27 = 0;
    if (uVar33 != 0) {
      if (0x26 < (long)pbVar38) {
        uVar27 = 0xff;
        goto LAB_003131b0;
      }
      uVar29 = 0x3f;
      if (uVar33 != 0) {
        for (; uVar33 >> uVar29 == 0; uVar29 = uVar29 - 1) {
        }
      }
      uVar33 = uVar33 << ((byte)(uVar29 ^ 0x3f) & 0x3f);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar33;
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar24 * 2 + 0x2ac) * 8);
      auVar5 = auVar5 * auVar11;
      if ((~auVar5._8_8_ & 0x3fffffffff) == 0) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar33;
        auVar12._8_8_ = 0;
        auVar12._0_8_ =
             *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar24 * 2 + 0x2ad) * 8);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = SUB168(auVar6 * auVar12,8);
        auVar5 = auVar5 + auVar21;
      }
      iVar26 = ((iVar24 * 0x3526a >> 0x10) - (int)(uVar29 ^ 0x3f)) - (auVar5._12_4_ >> 0x1f);
      iVar23 = iVar26 + 0xbe;
      bVar2 = auVar5[0xf] >> 7;
      uVar33 = auVar5._8_8_ >> (bVar2 | 0x26);
      if (iVar23 < 1) {
        uVar27 = 1 - iVar23;
        if (0x3f < uVar27) {
          uVar27 = 0;
          goto LAB_003131b0;
        }
        uVar33 = (uVar33 >> ((byte)uVar27 & 0x3f)) +
                 (ulong)((uVar33 >> ((ulong)uVar27 & 0x3f) & 1) != 0);
        uVar25 = (uint)uVar33 >> 1;
        uVar27 = (uint)(0xffffff < uVar33);
      }
      else {
        uVar29 = (ulong)((uint)uVar33 & 0x3fffffe);
        if (uVar33 << (bVar2 | 0x26) != auVar5._8_8_ || ((uint)uVar33 & 3) != 1) {
          uVar29 = uVar33;
        }
        if (1 < auVar5._0_8_) {
          uVar29 = uVar33;
        }
        if ((byte *)0x1b < pbVar38 + 0x11) {
          uVar29 = uVar33;
        }
        uVar29 = ((uint)uVar29 & 1) + uVar29;
        uVar27 = (iVar26 + 0xbf) - (uint)(uVar29 < 0x2000000);
        uVar25 = (uint)(uVar29 >> 1) & 0x37fffff;
        if (0x1ffffff < uVar29) {
          uVar25 = 0;
        }
        if (0xfe < uVar27) {
          uVar25 = 0;
          uVar27 = 0xff;
        }
      }
    }
  }
  if (((uint)aVar42.mantissa != uVar25) || (uVar34 != uVar27)) {
    answer.exponent = (int64_t)pbVar38;
    if (uVar39 == 0) {
      __assert_fail("input_num > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/fast_float/include/fast_float/float_common.h"
                    ,0xeb,"int fast_float::leading_zeroes(uint64_t)");
    }
    uVar33 = 0x3f;
    if (uVar39 != 0) {
      for (; uVar39 >> uVar33 == 0; uVar33 = uVar33 - 1) {
      }
    }
    uVar39 = uVar39 << ((byte)(uVar33 ^ 0x3f) & 0x3f);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar39;
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar24 * 2 + 0x2ac) * 8);
    uVar29 = SUB168(auVar7 * auVar13,8);
    if ((~uVar29 & 0x3fffffffff) == 0) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar39;
      auVar14._8_8_ = 0;
      auVar14._0_8_ =
           *(ulong *)(powers_template<void>::power_of_five_128 + (long)(iVar24 * 2 + 0x2ad) * 8);
      uVar29 = uVar29 + CARRY8(SUB168(auVar8 * auVar14,8),SUB168(auVar7 * auVar13,0));
    }
    aVar42.mantissa = uVar29 << ((byte)(uVar29 >> 0x3f) ^ 1);
    iVar26 = iVar24 * 0x3526a >> 0x10;
    iVar24 = -(int)(uVar33 ^ 0x3f) - (int)((long)uVar29 >> 0x3f);
    uVar34 = (iVar24 + iVar26) - 0x7f6a;
    if (iVar24 + iVar26 < 0x7f6a) {
      aVar42.power2 = uVar34;
      aVar42._12_4_ = 0;
      aVar42 = digit_comp<float,char>(&answer,aVar42);
      uVar34 = aVar42.power2;
      uVar39 = CONCAT53(answer.mantissa._3_5_,(undefined3)answer.mantissa);
    }
    else {
      uVar39 = 1;
    }
  }
LAB_003133ad:
  uVar27 = 0;
  if (uVar34 == 0xff) {
    uVar27 = 0x22;
  }
  uVar33 = 0x22;
  if (uVar34 != 0) {
    uVar33 = (ulong)uVar27;
  }
  if (aVar42.mantissa != 0) {
    uVar33 = (ulong)uVar27;
  }
  fVar17._8_8_ = uVar33;
  fVar17.ptr = (char *)pbVar31;
  *value = (float)((uint)answer.negative << 0x1f | uVar34 << 0x17 | (uint)aVar42.mantissa);
  if (uVar39 != 0) {
    return fVar17;
  }
  fVar18.ec = uVar27;
  fVar18.ptr = (char *)pbVar31;
  fVar18._12_4_ = 0;
  return fVar18;
}

Assistant:

FASTFLOAT_CONSTEXPR20
from_chars_result_t<UC> from_chars_advanced(UC const * first, UC const * last,
                                      T &value, parse_options_t<UC> options)  noexcept  {

  static_assert (std::is_same<T, double>::value || std::is_same<T, float>::value, "only float and double are supported");
  static_assert (std::is_same<UC, char>::value ||
                 std::is_same<UC, wchar_t>::value ||
                 std::is_same<UC, char16_t>::value ||
                 std::is_same<UC, char32_t>::value , "only char, wchar_t, char16_t and char32_t are supported");

  from_chars_result_t<UC> answer;
#ifdef FASTFLOAT_SKIP_WHITE_SPACE  // disabled by default
  while ((first != last) && fast_float::is_space(uint8_t(*first))) {
    first++;
  }
#endif
  if (first == last) {
    answer.ec = std::errc::invalid_argument;
    answer.ptr = first;
    return answer;
  }
  parsed_number_string_t<UC> pns = parse_number_string<UC>(first, last, options);
  if (!pns.valid) {
    return detail::parse_infnan(first, last, value);
  }

  answer.ec = std::errc(); // be optimistic
  answer.ptr = pns.lastmatch;
  // The implementation of the Clinger's fast path is convoluted because
  // we want round-to-nearest in all cases, irrespective of the rounding mode
  // selected on the thread.
  // We proceed optimistically, assuming that detail::rounds_to_nearest() returns
  // true.
  if (binary_format<T>::min_exponent_fast_path() <= pns.exponent && pns.exponent <= binary_format<T>::max_exponent_fast_path() && !pns.too_many_digits) {
    // Unfortunately, the conventional Clinger's fast path is only possible
    // when the system rounds to the nearest float.
    //
    // We expect the next branch to almost always be selected.
    // We could check it first (before the previous branch), but
    // there might be performance advantages at having the check
    // be last.
    if(!cpp20_and_in_constexpr() && detail::rounds_to_nearest())  {
      // We have that fegetround() == FE_TONEAREST.
      // Next is Clinger's fast path.
      if (pns.mantissa <=binary_format<T>::max_mantissa_fast_path()) {
        value = T(pns.mantissa);
        if (pns.exponent < 0) { value = value / binary_format<T>::exact_power_of_ten(-pns.exponent); }
        else { value = value * binary_format<T>::exact_power_of_ten(pns.exponent); }
        if (pns.negative) { value = -value; }
        return answer;
      }
    } else {
      // We do not have that fegetround() == FE_TONEAREST.
      // Next is a modified Clinger's fast path, inspired by Jakub Jelínek's proposal
      if (pns.exponent >= 0 && pns.mantissa <=binary_format<T>::max_mantissa_fast_path(pns.exponent)) {
#if defined(__clang__)
        // Clang may map 0 to -0.0 when fegetround() == FE_DOWNWARD
        if(pns.mantissa == 0) {
          value = pns.negative ? -0. : 0.;
          return answer;
        }
#endif
        value = T(pns.mantissa) * binary_format<T>::exact_power_of_ten(pns.exponent);
        if (pns.negative) { value = -value; }
        return answer;
      }
    }
  }
  adjusted_mantissa am = compute_float<binary_format<T>>(pns.exponent, pns.mantissa);
  if(pns.too_many_digits && am.power2 >= 0) {
    if(am != compute_float<binary_format<T>>(pns.exponent, pns.mantissa + 1)) {
      am = compute_error<binary_format<T>>(pns.exponent, pns.mantissa);
    }
  }
  // If we called compute_float<binary_format<T>>(pns.exponent, pns.mantissa) and we have an invalid power (am.power2 < 0),
  // then we need to go the long way around again. This is very uncommon.
  if(am.power2 < 0) { am = digit_comp<T>(pns, am); }
  to_float(pns.negative, am, value);
  // Test for over/underflow.
  if ((pns.mantissa != 0 && am.mantissa == 0 && am.power2 == 0) || am.power2 == binary_format<T>::infinite_power()) {
    answer.ec = std::errc::result_out_of_range;
  }
  return answer;
}